

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod_inv.c
# Opt level: O0

int32 mod_inv_read_tmat(model_inventory_t *minv,char *fn,float32 floor)

{
  int iVar1;
  uint local_40;
  uint local_3c;
  uint32 j;
  uint32 i;
  uint32 n_state_pm;
  uint32 n_tmat;
  float32 ***tmat;
  char *pcStack_20;
  float32 floor_local;
  char *fn_local;
  model_inventory_t *minv_local;
  
  tmat._4_4_ = floor;
  pcStack_20 = fn;
  fn_local = (char *)minv;
  iVar1 = s3tmat_read(fn,(float32 ****)&n_state_pm,&i,&j);
  if (iVar1 == 0) {
    if (((float)tmat._4_4_ != 0.0) || (NAN((float)tmat._4_4_))) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x12d,"inserting tprob floor %e and renormalizing\n",(double)(float)tmat._4_4_);
      for (local_3c = 0; local_3c < i; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < j - 1; local_40 = local_40 + 1) {
          vector_normalize((vector_t)_n_state_pm[local_3c][local_40],j);
          vector_nz_floor((vector_t)_n_state_pm[local_3c][local_40],j,tmat._4_4_);
          vector_normalize((vector_t)_n_state_pm[local_3c][local_40],j);
        }
      }
    }
    *(float32 ****)(fn_local + 0x58) = _n_state_pm;
    *(uint32 *)(fn_local + 0x70) = i;
    *(uint32 *)(fn_local + 0x74) = j;
    minv_local._4_4_ = 0;
  }
  else {
    minv_local._4_4_ = -1;
  }
  return minv_local._4_4_;
}

Assistant:

int32
mod_inv_read_tmat(model_inventory_t *minv,
		  const char *fn,
		  float32 floor)
{
    float32 ***tmat;
    uint32 n_tmat;
    uint32 n_state_pm;
    uint32 i, j;

    if (s3tmat_read(fn,
		    &tmat,
		    &n_tmat,
		    &n_state_pm) != S3_SUCCESS) {
	return S3_ERROR;
    }

    if (floor != 0) {
	E_INFO("inserting tprob floor %e and renormalizing\n",
	       floor);
    
	for (i = 0; i < n_tmat; i++) {
	    for (j = 0; j < n_state_pm-1; j++) {
		vector_normalize(tmat[i][j], n_state_pm);
		vector_nz_floor(tmat[i][j], n_state_pm, floor);
		vector_normalize(tmat[i][j], n_state_pm);
	    }
	}
    }

    minv->tmat = tmat;
    minv->n_tmat = n_tmat;
    minv->n_state_pm = n_state_pm;

    return S3_SUCCESS;
}